

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

InterchangeObject * __thiscall
ASDCP::MXF::InterchangeObject::InitFromBuffer(InterchangeObject *this,byte_t *p,ui32_t l)

{
  ILogSink *this_00;
  uint in_ECX;
  undefined4 in_register_00000014;
  Result_t result;
  TLVReader MemRDR;
  KLVPacket local_138;
  int local_d0 [26];
  TLVReader local_68;
  
  if (CONCAT44(in_register_00000014,l) == 0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
    return this;
  }
  Kumu::Result_t::Result_t((Result_t *)local_d0,(Result_t *)Kumu::RESULT_FALSE);
  if (p[0x30] == '\x01') {
    KLVPacket::InitFromBuffer(&local_138,p,l,(UL *)(ulong)in_ECX);
    Kumu::Result_t::operator=((Result_t *)local_d0,(Result_t *)&local_138);
    Kumu::Result_t::~Result_t((Result_t *)&local_138);
    if (-1 < local_d0[0]) {
      if ((byte_t *)(CONCAT44(in_register_00000014,l) + (ulong)in_ECX) <
          *(byte_t **)(p + 0x18) + *(long *)(p + 0x20)) {
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(this_00,"Interchange Object value extends past buffer length.\n");
        local_138._vptr_KLVPacket._0_4_ = 0x5c9;
        Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
        goto LAB_001981aa;
      }
      TLVReader::TLVReader
                (&local_68,*(byte_t **)(p + 0x18),(ui32_t)*(long *)(p + 0x20),
                 *(IPrimerLookup **)(p + 0x50));
      (**(code **)(*(long *)p + 0x60))(&local_138,p,&local_68);
      Kumu::Result_t::operator=((Result_t *)local_d0,(Result_t *)&local_138);
      Kumu::Result_t::~Result_t((Result_t *)&local_138);
      std::
      _Rb_tree<ASDCP::TagValue,_std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~_Rb_tree(&local_68.m_ElementMap._M_t);
    }
  }
  else {
    KLVPacket::InitFromBuffer(&local_138,p,l);
    Kumu::Result_t::operator=((Result_t *)local_d0,(Result_t *)&local_138);
    Kumu::Result_t::~Result_t((Result_t *)&local_138);
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_d0);
LAB_001981aa:
  Kumu::Result_t::~Result_t((Result_t *)local_d0);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::InterchangeObject::InitFromBuffer(const byte_t* p, ui32_t l)
{
  ASDCP_TEST_NULL(p);
  Result_t result = RESULT_FALSE;

  if ( m_UL.HasValue() )
    {
      result = KLVPacket::InitFromBuffer(p, l, m_UL);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( ( m_ValueStart + m_ValueLength ) > ( p  + l ) )
	    {
	      DefaultLogSink().Error("Interchange Object value extends past buffer length.\n");
	      return RESULT_KLV_CODING(__LINE__, __FILE__);
	    }

	  TLVReader MemRDR(m_ValueStart, m_ValueLength, m_Lookup);
	  result = InitFromTLVSet(MemRDR);
	}
    }
  else
    {
      result = KLVPacket::InitFromBuffer(p, l);
    }
  
  return result;
}